

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  size_t checkpoint;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar8;
  void *pvVar9;
  ulong uVar10;
  secp256k1_gej *r_00;
  long lVar11;
  secp256k1_gej *b;
  secp256k1_ge *psVar12;
  secp256k1_scalar *psVar13;
  secp256k1_ge *psVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  byte bVar23;
  long local_130;
  size_t local_f8;
  secp256k1_gej running_sum;
  
  bVar23 = 0;
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  secp256k1_gej_set_infinity(r);
  iVar7 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar11 = n_points * 2 + 2;
    local_f8 = n_points;
    uVar6 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x68);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x20);
    plVar8 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar8 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x10);
      plVar8[1] = (long)pvVar9;
      bVar5 = 0x7f / (byte)(uVar6 + 1);
      uVar17 = (uint)bVar5;
      uVar10 = (ulong)(bVar5 + 1);
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * uVar10 * 4);
      *plVar8 = (long)pvVar9;
      bVar5 = (byte)uVar6;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x98L << (bVar5 & 0x3f));
      if ((plVar8[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar8 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar11 = 0;
        }
        else {
          uVar2 = inp_g_sc->d[0];
          uVar3 = inp_g_sc->d[1];
          uVar4 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar4;
          s1->d[0] = uVar2;
          s1->d[1] = uVar3;
          psVar12 = &secp256k1_ge_const_g;
          psVar14 = p1;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar14->x).n[0] = (psVar12->x).n[0];
            psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar23 * -2 + 1) * 8);
            psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar23 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar11 = 2;
        }
        psVar13 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar11 << 5));
        psVar12 = p1 + lVar11;
        do {
          bVar22 = local_f8 == 0;
          local_f8 = local_f8 - 1;
          if (bVar22) {
            local_130 = 0;
            psVar13 = s1;
            psVar12 = p1;
            for (lVar18 = 0; lVar11 != lVar18; lVar18 = lVar18 + 1) {
              iVar7 = secp256k1_scalar_is_zero(psVar13);
              if ((iVar7 == 0) && (iVar7 = secp256k1_ge_is_infinity(psVar12), iVar7 == 0)) {
                *(long *)(plVar8[1] + 8 + local_130 * 0x10) = lVar18;
                iVar7 = secp256k1_wnaf_fixed
                                  ((int *)(local_130 * uVar10 * 4 + *plVar8),psVar13,uVar6 + 1);
                *(int *)(plVar8[1] + local_130 * 0x10) = iVar7;
                local_130 = local_130 + 1;
              }
              psVar12 = psVar12 + 1;
              psVar13 = psVar13 + 1;
            }
            secp256k1_gej_set_infinity(r);
            if (local_130 != 0) {
              lVar18 = 1L << (bVar5 & 0x3f);
              for (; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
                for (lVar19 = 0; lVar18 * 0x98 != lVar19; lVar19 = lVar19 + 0x98) {
                  secp256k1_gej_set_infinity((secp256k1_gej *)((long)(r_00->x).n + lVar19));
                }
                lVar20 = (ulong)uVar17 << 2;
                lVar19 = 8;
                lVar21 = local_130;
                while (bVar22 = lVar21 != 0, lVar21 = lVar21 + -1, uVar16 = uVar6, bVar22) {
                  uVar16 = *(uint *)(*plVar8 + lVar20);
                  lVar1 = *(long *)(plVar8[1] + lVar19);
                  if ((uVar17 == 0) && (*(int *)(plVar8[1] + -8 + lVar19) != 0)) {
                    secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar1);
                    secp256k1_gej_add_ge_var
                              (r_00,r_00,(secp256k1_ge *)&running_sum,(secp256k1_fe *)0x0);
                  }
                  if ((int)uVar16 < 1) {
                    if ((int)uVar16 < 0) {
                      uVar16 = ~uVar16;
                      secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar1);
                      b = &running_sum;
                      goto LAB_00137714;
                    }
                  }
                  else {
                    uVar16 = uVar16 - 1;
                    b = (secp256k1_gej *)(p1 + lVar1);
LAB_00137714:
                    secp256k1_gej_add_ge_var
                              (r_00 + (uVar16 >> 1),r_00 + (uVar16 >> 1),(secp256k1_ge *)b,
                               (secp256k1_fe *)0x0);
                  }
                  lVar19 = lVar19 + 0x10;
                  lVar20 = lVar20 + (0x7f / ((ulong)uVar6 + 1)) * 4 + 4;
                }
                while (uVar16 != 0) {
                  secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
                  uVar16 = uVar16 - 1;
                }
                secp256k1_gej_set_infinity(&running_sum);
                lVar19 = lVar18;
                while (1 < lVar19) {
                  lVar19 = lVar19 + -1;
                  secp256k1_gej_add_var
                            (&running_sum,&running_sum,r_00 + ((uint)lVar19 & 0x7fffffff),
                             (secp256k1_fe *)0x0);
                  secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
                }
                secp256k1_gej_add_var(&running_sum,&running_sum,r_00,(secp256k1_fe *)0x0);
                secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
                secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
              }
            }
            lVar18 = 0;
            for (lVar19 = 0; lVar11 != lVar19; lVar19 = lVar19 + 1) {
              s1[lVar19].d[2] = 0;
              (s1[lVar19].d + 2)[1] = 0;
              s1[lVar19].d[0] = 0;
              s1[lVar19].d[1] = 0;
              *(undefined4 *)(plVar8[1] + lVar19 * 0x10) = 0;
              lVar21 = *plVar8;
              for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
                *(undefined4 *)(lVar21 + lVar18 + uVar15 * 4) = 0;
              }
              lVar18 = lVar18 + (0x7f / ((ulong)uVar6 + 1)) * 4 + 4;
            }
            for (uVar6 = 0; uVar6 >> (bVar5 & 0x1f) == 0; uVar6 = uVar6 + 1) {
              secp256k1_gej_clear(r_00);
              r_00 = r_00 + 1;
            }
            secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
            return 1;
          }
          iVar7 = (*cb)(psVar13,psVar12,cb_offset,cbdata);
          if (iVar7 == 0) break;
          secp256k1_ecmult_endo_split(psVar13,psVar13 + 1,psVar12,psVar12 + 1);
          lVar11 = lVar11 + 2;
          psVar13 = psVar13 + 2;
          psVar12 = psVar12 + 2;
          cb_offset = cb_offset + 1;
        } while( true );
      }
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}